

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,bool quote_string_type)

{
  FieldDescriptor FVar1;
  string *src;
  long lVar2;
  uint uVar3;
  LogMessage *pLVar4;
  code *other;
  long *plVar5;
  int **ppiVar6;
  size_type *psVar7;
  char *pcVar8;
  pointer pcVar9;
  char *pcVar10;
  pointer pcVar11;
  undefined1 local_78 [16];
  int *local_68;
  _Alloc_hider _Stack_60;
  string local_40;
  
  other = (code *)this;
  if (this[0x98] == (FieldDescriptor)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x729);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)local_78,"CHECK failed: has_default_value(): ");
    other = (code *)internal::LogMessage::operator<<(pLVar4,"No default value");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,(LogMessage *)other);
    internal::LogMessage::~LogMessage((LogMessage *)local_78);
  }
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    other = TypeOnceInit;
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
  }
  uVar3 = *(uint *)(this + 0x48);
  switch(*(undefined4 *)(kTypeToCppTypeMap + (ulong)uVar3 * 4)) {
  case 1:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0xa0),0x3a5de0)
    ;
    break;
  case 2:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,*(protobuf **)(this + 0xa0),0x3a5de0);
    break;
  case 3:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0xa0),0x3a5de0)
    ;
    break;
  case 4:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,*(protobuf **)(this + 0xa0),0x3a5de0);
    break;
  case 5:
    SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)other,*(double *)(this + 0xa0));
    break;
  case 6:
    SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)other,*(float *)(this + 0xa0));
    break;
  case 7:
    FVar1 = this[0xa0];
    pcVar10 = "false";
    if ((ulong)(byte)FVar1 != 0) {
      pcVar10 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = pcVar10 + ((ulong)(byte)FVar1 ^ 5);
    goto LAB_002d6715;
  case 8:
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
    }
    plVar5 = (long *)**(long **)(this + 0xa0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = (pointer)*plVar5;
    pcVar9 = pcVar11 + plVar5[1];
    goto LAB_002d66bc;
  case 9:
    if (quote_string_type) {
      CEscape(&local_40,*(string **)(this + 0xa0));
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x351813);
      ppiVar6 = (int **)(plVar5 + 2);
      if ((int **)*plVar5 == ppiVar6) {
        local_68 = *ppiVar6;
        _Stack_60._M_p = (pointer)plVar5[3];
        local_78._0_8_ = &local_68;
      }
      else {
        local_68 = *ppiVar6;
        local_78._0_8_ = (int **)*plVar5;
      }
      local_78._8_8_ = plVar5[1];
      *plVar5 = (long)ppiVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(local_78);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((int **)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_,(long)local_68 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
      uVar3 = *(uint *)(this + 0x48);
    }
    src = *(string **)(this + 0xa0);
    if (uVar3 == 0xc) {
      CEscape(__return_storage_ptr__,src);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = (src->_M_dataplus)._M_p;
    pcVar9 = pcVar11 + src->_M_string_length;
LAB_002d66bc:
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar11,pcVar9);
    break;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x74f);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)local_78,"Messages can\'t have default values!");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)local_78);
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x752);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)local_78,
                        "Can\'t get here: failed to get default value as string");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)local_78);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "";
    pcVar10 = "";
LAB_002d6715:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar10,pcVar8)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldDescriptor::DefaultValueAsString(bool quote_string_type) const {
  GOOGLE_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return SimpleItoa(default_value_int32());
      break;
    case CPPTYPE_INT64:
      return SimpleItoa(default_value_int64());
      break;
    case CPPTYPE_UINT32:
      return SimpleItoa(default_value_uint32());
      break;
    case CPPTYPE_UINT64:
      return SimpleItoa(default_value_uint64());
      break;
    case CPPTYPE_FLOAT:
      return SimpleFtoa(default_value_float());
      break;
    case CPPTYPE_DOUBLE:
      return SimpleDtoa(default_value_double());
      break;
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
      break;
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return "\"" + CEscape(default_value_string()) + "\"";
      } else {
        if (type() == TYPE_BYTES) {
          return CEscape(default_value_string());
        } else {
          return default_value_string();
        }
      }
      break;
    case CPPTYPE_ENUM:
      return default_value_enum()->name();
      break;
    case CPPTYPE_MESSAGE:
      GOOGLE_LOG(DFATAL) << "Messages can't have default values!";
      break;
  }
  GOOGLE_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}